

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void krawtchouk(int n,double p,double x,int m,double *v)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  double dVar5;
  
  if (n < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"KRAWTCHOUK - Fatal error!\n");
    pcVar2 = "  0 <= N is required.\n";
  }
  else if ((p <= 0.0) || (1.0 <= p)) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"KRAWTCHOUK - Fatal error!\n");
    pcVar2 = "  0 < P < 1 is required.\n";
  }
  else {
    if (-1 < m) {
      *v = 1.0;
      if (n != 0) {
        v[1] = x - (double)m * p;
      }
      if (1 < n) {
        dVar5 = v[1];
        iVar1 = m + -2;
        uVar3 = 1;
        iVar4 = 2;
        do {
          dVar5 = ((x - ((double)iVar1 * p + (double)(int)uVar3)) * dVar5 -
                  (double)m * p * (1.0 - p) * v[uVar3 - 1]) / (double)iVar4;
          v[uVar3 + 1] = dVar5;
          uVar3 = uVar3 + 1;
          iVar1 = iVar1 + -2;
          m = m + -1;
          iVar4 = iVar4 + 1;
        } while ((uint)n != uVar3);
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"KRAWTCHOUK - Fatal error!\n");
    pcVar2 = "  0 <= M is required.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar2);
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void krawtchouk ( int n, double p, double x, int m, double v[] )

//****************************************************************************80
//
//  Purpose:
//
//    KRAWTCHOUK evaluates the Krawtchouk polynomials at X.
//
//  Discussion:
//
//    The polynomial has a parameter P, which must be striclty between
//    0 and 1, and a parameter M which must be a nonnegative integer.
//
//    The Krawtchouk polynomial of order N, with parameters P and M,
//    evaluated at X, may be written K(N,P,X,M).
//
//    The first two terms are:
//
//      K(0,P,X,M) = 1
//      K(1,P,X,M) = X - P * M
//
//    and the recursion, for fixed P and M is
//
//                             ( N + 1 ) * K(N+1,P,X,M) =
//        ( X - ( N + P * ( M - 2 * N))) * K(N,  P,X,M)
//       - ( M - N + 1 ) * P * ( 1 - P ) * K(N-1,P,X,M)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 March 2009
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Walter Gautschi,
//    Orthogonal Polynomials: Computation and Approximation,
//    Oxford, 2004,
//    ISBN: 0-19-850672-4,
//    LC: QA404.5 G3555.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to evaluate.
//    0 <= N.
//
//    Input, double P, the parameter.  0 < P < 1.
//
//    Input, double X, the evaluation parameter.
//
//    Input, int M, the parameter.  0 <= M.
//
//    Output, double V[N+1], the values of the Krawtchouk polynomials
//    of orders 0 through N at X.
//
{
  int i;

  if ( n < 0 )
  {
    std::cerr << "\n";
    std::cerr << "KRAWTCHOUK - Fatal error!\n";
    std::cerr << "  0 <= N is required.\n";
    exit ( 1 );
  }

  if ( p <= 0.0 || 1.0 <= p )
  {
    std::cerr << "\n";
    std::cerr << "KRAWTCHOUK - Fatal error!\n";
    std::cerr << "  0 < P < 1 is required.\n";
    exit ( 1 );
  }

  if ( m < 0 )
  {
    std::cerr << "\n";
    std::cerr << "KRAWTCHOUK - Fatal error!\n";
    std::cerr << "  0 <= M is required.\n";
    exit ( 1 );
  }

  v[0] = 1.0;

  if ( 1 <= n )
  {
    v[1] = x - p * double( m );
  }

  for ( i = 1; i < n; i++ )
  {
    v[i+1] = ( 
      ( x - ( double( i ) + p * double( m - 2 * i ) ) ) * v[i] 
      - double( m - i + 1 ) * p * ( 1.0 - p ) * v[i-1]
      ) / double( i + 1 );
  }

  return;
}